

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

uint ON_SubDMeshFragment::QuadGridPointCountFromSideCount(uint side_segment_count)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (side_segment_count - 1 < 0x40) {
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      uVar2 = uVar3 * 2;
    } while (uVar3 < side_segment_count);
    bVar1 = true;
    if (uVar3 <= side_segment_count) goto LAB_0061354e;
  }
  ON_SubDIncrementErrorCount();
  bVar1 = false;
LAB_0061354e:
  iVar4 = 0;
  if (bVar1) {
    iVar4 = side_segment_count + 1;
  }
  return iVar4 * iVar4;
}

Assistant:

unsigned int ON_SubDMeshFragment::QuadGridPointCountFromSideCount(
  unsigned int side_segment_count
  )
{
  unsigned int side_point_count = ON_SubDMeshFragment::SidePointCountFromSideCount(side_segment_count);
  return side_point_count*side_point_count;
}